

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O1

bool absl::lts_20240722::container_internal::operator==(iterator *a,iterator *b)

{
  slot_type *psVar1;
  slot_type *psVar2;
  slot_type *psVar3;
  SCC *pSVar4;
  slot_type *psVar5;
  slot_type *psVar6;
  bool bVar7;
  slot_type *psVar8;
  SCC **key;
  tuple<> tStack_31;
  tuple<const_google::protobuf::compiler::SCC_*const_&> tStack_30;
  
  psVar1 = (slot_type *)a->ctrl_;
  if ((psVar1 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ ||
       psVar1 == (slot_type *)0x0) || (-1 < (char)*(code *)psVar1)) {
    psVar2 = (slot_type *)b->ctrl_;
    if ((psVar2 != (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
         psVar2 != (slot_type *)0x0) && ((char)*(code *)psVar2 < '\0')) goto LAB_001f3022;
    if (psVar1 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_ &&
        psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) {
LAB_001f3015:
      return psVar1 == psVar2;
    }
    if ((psVar1 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_) !=
        (psVar2 == (slot_type *)google::protobuf::internal::TypeCardToString_abi_cxx11_))
    goto LAB_001f3027;
    if (psVar1 == (slot_type *)0x0 || psVar2 == (slot_type *)0x0) goto LAB_001f3015;
    if ((psVar2 == (slot_type *)&kSooControl) == (psVar1 == (slot_type *)&kSooControl)) {
      a = (iterator *)(a->field_1).slot_;
      psVar3 = (b->field_1).slot_;
      if (psVar1 == (slot_type *)&kSooControl) {
        bVar7 = (slot_type *)a == psVar3;
      }
      else {
        psVar8 = psVar3;
        psVar5 = psVar2;
        psVar6 = (slot_type *)a;
        if (psVar2 < psVar1) {
          psVar8 = (slot_type *)a;
          psVar5 = psVar1;
          psVar6 = psVar3;
        }
        b = (iterator *)CONCAT71((int7)((ulong)psVar5 >> 8),psVar5 < psVar6);
        bVar7 = psVar6 <= psVar8 && psVar5 < psVar6;
      }
      if (bVar7) goto LAB_001f3015;
    }
  }
  else {
    operator==();
LAB_001f3022:
    operator==();
LAB_001f3027:
    operator==();
  }
  operator==();
  pSVar4 = ((value_type *)a)->first;
  if (pSVar4 == (SCC *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
    ::iterator::operator*((iterator *)a);
  }
  else if (pSVar4 != (SCC *)google::protobuf::internal::TypeCardToString_abi_cxx11_) {
    if (-1 < (char)*(code *)&(pSVar4->descriptors).
                             super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) {
      return SUB81(*(undefined8 *)&((value_type *)a)->second,0);
    }
    goto LAB_001f3060;
  }
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
  ::iterator::operator*((iterator *)a);
LAB_001f3060:
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
  ::iterator::operator*((iterator *)a);
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
  ::find_or_prepare_insert<google::protobuf::compiler::SCC_const*>
            ((pair<absl::lts_20240722::container_internal::raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<const_google::protobuf::compiler::SCC_*,_google::protobuf::compiler::cpp::MessageAnalysis>,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Hash,_absl::lts_20240722::container_internal::HashEq<const_google::protobuf::compiler::SCC_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::compiler::SCC_*const,_google::protobuf::compiler::cpp::MessageAnalysis>_>_>::iterator,_bool>
              *)a,(raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
                   *)b,key);
  if (*(char *)((slot_type *)a + 1) == '\x01') {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
    ::
    emplace_at<std::piecewise_construct_t_const&,std::tuple<google::protobuf::compiler::SCC_const*const&>,std::tuple<>>
              ((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<google::protobuf::compiler::SCC_const*,google::protobuf::compiler::cpp::MessageAnalysis>,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Hash,absl::lts_20240722::container_internal::HashEq<google::protobuf::compiler::SCC_const*,void>::Eq,std::allocator<std::pair<google::protobuf::compiler::SCC_const*const,google::protobuf::compiler::cpp::MessageAnalysis>>>
                *)b,*a,(piecewise_construct_t *)&std::piecewise_construct,&tStack_30,&tStack_31);
  }
  return SUB81(a,0);
}

Assistant:

bool operator==(const iterator& a, const iterator& b) {
      AssertIsValidForComparison(a.ctrl_, a.generation(), a.generation_ptr());
      AssertIsValidForComparison(b.ctrl_, b.generation(), b.generation_ptr());
      AssertSameContainer(a.ctrl_, b.ctrl_, a.slot_, b.slot_,
                          a.generation_ptr(), b.generation_ptr());
      return a.ctrl_ == b.ctrl_;
    }